

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uniforms.cpp
# Opt level: O3

void __thiscall Uniforms::checkUniforms(Uniforms *this,string *_vert_src,string *_frag_src)

{
  _Rb_tree_header *p_Var1;
  bool bVar2;
  bool bVar3;
  _Base_ptr p_Var4;
  string name;
  string arrayName;
  long *local_80 [2];
  long local_70 [2];
  long *local_60 [2];
  long local_50 [2];
  Uniforms *local_40;
  string *local_38;
  
  p_Var4 = (this->functions)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var1 = &(this->functions)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var4 != p_Var1) {
    local_40 = this;
    local_38 = _vert_src;
    do {
      local_80[0] = local_70;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_80,*(long *)(p_Var4 + 1),
                 (long)&(p_Var4[1]._M_parent)->_M_color + *(long *)(p_Var4 + 1));
      std::__cxx11::string::append((char *)local_80);
      local_60[0] = local_50;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_60,*(long *)(p_Var4 + 1),
                 (long)&(p_Var4[1]._M_parent)->_M_color + *(long *)(p_Var4 + 1));
      std::__cxx11::string::append((char *)local_60);
      bVar2 = findId(local_38,(char *)local_80[0]);
      bVar3 = true;
      if (!bVar2) {
        bVar2 = findId(_frag_src,(char *)local_80[0]);
        if (!bVar2) {
          bVar3 = findId(_frag_src,(char *)local_60[0]);
        }
      }
      if ((bool)(char)p_Var4[5]._M_color != bVar3) {
        *(bool *)&p_Var4[5]._M_color = bVar3;
        local_40->m_change = true;
      }
      if (local_60[0] != local_50) {
        operator_delete(local_60[0],local_50[0] + 1);
      }
      if (local_80[0] != local_70) {
        operator_delete(local_80[0],local_70[0] + 1);
      }
      p_Var4 = (_Base_ptr)std::_Rb_tree_increment(p_Var4);
    } while ((_Rb_tree_header *)p_Var4 != p_Var1);
  }
  return;
}

Assistant:

void Uniforms::checkUniforms( const std::string &_vert_src, const std::string &_frag_src ) {
    // Check active native uniforms
    for (UniformFunctionsMap::iterator it = functions.begin(); it != functions.end(); ++it) {
        std::string name = it->first + ";";
        std::string arrayName = it->first + "[";
        bool present = ( findId(_vert_src, name.c_str()) || findId(_frag_src, name.c_str()) || findId(_frag_src, arrayName.c_str()) );
        if ( it->second.present != present ) {
            it->second.present = present;
            m_change = true;
        } 
    }
}